

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O0

bool __thiscall
ON_ArcCurve::GetNurbFormParameterFromCurveParameter
          (ON_ArcCurve *this,double curve_t,double *nurbs_t)

{
  double dVar1;
  ON_Interval local_58;
  byte local_41;
  double dStack_40;
  bool rc;
  double arcnurb_t;
  double local_28;
  double radians;
  double *nurbs_t_local;
  double curve_t_local;
  ON_ArcCurve *this_local;
  
  radians = (double)nurbs_t;
  nurbs_t_local = (double *)curve_t;
  curve_t_local = (double)this;
  _arcnurb_t = ON_Arc::DomainRadians(&this->m_arc);
  dVar1 = ON_Interval::NormalizedParameterAt(&this->m_t,(double)nurbs_t_local);
  local_28 = ON_Interval::ParameterAt((ON_Interval *)&arcnurb_t,dVar1);
  local_41 = ON_Arc::GetNurbFormParameterFromRadian(&this->m_arc,local_28,&stack0xffffffffffffffc0);
  if ((bool)local_41) {
    local_58 = ON_Arc::DomainRadians(&this->m_arc);
    dVar1 = ON_Interval::NormalizedParameterAt(&local_58,dStack_40);
    dVar1 = ON_Interval::ParameterAt(&this->m_t,dVar1);
    *(double *)radians = dVar1;
  }
  else {
    *(double **)radians = nurbs_t_local;
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool ON_ArcCurve::GetNurbFormParameterFromCurveParameter(
      double curve_t,
      double* nurbs_t
      ) const
{
  double radians = m_arc.DomainRadians().ParameterAt(m_t.NormalizedParameterAt(curve_t));
  double arcnurb_t;
  bool rc = m_arc.GetNurbFormParameterFromRadian(radians,&arcnurb_t);
  if (rc)        // Oct 29, 2009 - Dale Lear added condition to set *nurbs_t = curve_t
    *nurbs_t = m_t.ParameterAt(m_arc.DomainRadians().NormalizedParameterAt(arcnurb_t));
  else
    *nurbs_t = curve_t;
  return rc;
}